

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall llvm::ItaniumPartialDemangler::hasFunctionQualifiers(ItaniumPartialDemangler *this)

{
  bool bVar1;
  
  if (this->RootNode != (void *)0x0) {
    bVar1 = isFunction(this);
    if (bVar1) {
      bVar1 = true;
      if (*(int *)((long)this->RootNode + 0x38) == 0) {
        bVar1 = *(char *)((long)this->RootNode + 0x3c) != '\0';
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  __assert_fail("RootNode != nullptr && \"must call partialDemangle()\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                ,0x1432,"bool llvm::ItaniumPartialDemangler::hasFunctionQualifiers() const");
}

Assistant:

bool ItaniumPartialDemangler::hasFunctionQualifiers() const {
  assert(RootNode != nullptr && "must call partialDemangle()");
  if (!isFunction())
    return false;
  auto *E = static_cast<FunctionEncoding *>(RootNode);
  return E->getCVQuals() != QualNone || E->getRefQual() != FrefQualNone;
}